

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O0

void wallet::group_outputs_tests::addCoin
               (CoinsResult *coins,CWallet *wallet,CTxDestination *dest,CAmount *nValue,
               bool is_from_me,CFeeRate fee_rate,int depth)

{
  long lVar1;
  CAmount CVar2;
  optional<CFeeRate> feerate;
  byte bVar3;
  int input_bytes;
  reference pvVar4;
  CTxOut *txout_00;
  OutputType *pOVar5;
  CWallet *wallet_00;
  CAmount *in_RCX;
  uint uVar6;
  COutput *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  pVar7;
  undefined4 in_stack_00000008;
  value_type *txout;
  CWalletTx *wtx;
  CMutableTransaction tx;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  ret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  uint256 txid;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 uVar8;
  uint32_t in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  COutPoint *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  CWalletTx *in_stack_fffffffffffffd28;
  char *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  OutputType in_stack_fffffffffffffd3c;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd68;
  OutputType depth_00;
  int64_t in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffdf0;
  CoinsResult *local_168;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_R8B & 1;
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  nextLockTime = nextLockTime + 1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd28,
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  CVar2 = *in_RCX;
  pvVar4 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd18,
                      CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  pvVar4->nValue = CVar2;
  GetScriptForDestination
            ((CTxDestination *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd18,
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  CScript::operator=((CScript *)in_stack_fffffffffffffd18,
                     (CScript *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  CMutableTransaction::GetHash((CMutableTransaction *)in_stack_fffffffffffffd28);
  transaction_identifier<false>::ToUint256
            ((transaction_identifier<false> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),in_stack_fffffffffffffd40
             ,(char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd28 >> 0x18,0));
  std::forward_as_tuple<uint256_const&>
            ((uint256 *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  ::MakeTransactionRef<CMutableTransaction>
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  TxStateInactive::TxStateInactive
            ((TxStateInactive *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),false)
  ;
  std::forward_as_tuple<std::shared_ptr<CTransaction_const>,wallet::TxStateInactive>
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (TxStateInactive *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  pVar7 = std::
          unordered_map<uint256,wallet::CWalletTx,SaltedTxidHasher,std::equal_to<uint256>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>>
          ::
          emplace<std::piecewise_construct_t_const&,std::tuple<uint256_const&>,std::tuple<std::shared_ptr<CTransaction_const>&&,wallet::TxStateInactive&&>>
                    ((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                      *)in_stack_fffffffffffffd28,
                     (piecewise_construct_t *)
                     CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                     (tuple<const_uint256_&> *)in_stack_fffffffffffffd18,
                     (tuple<std::shared_ptr<const_CTransaction>_&&,_wallet::TxStateInactive_&&> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __assert_fail("ret.second",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                  ,0x2e,
                  "void wallet::group_outputs_tests::addCoin(CoinsResult &, CWallet &, const CTxDestination &, const CAmount &, bool, CFeeRate, int)"
                 );
  }
  std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator*
            ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::at
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd18,
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  OutputTypeFromDestination
            ((CTxDestination *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  txout_00 = (CTxOut *)
             inline_assertion_check<true,std::optional<OutputType>>
                       ((optional<OutputType> *)
                        CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                        (char *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                        in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  pOVar5 = std::optional<OutputType>::operator*
                     ((optional<OutputType> *)
                      CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  depth_00 = *pOVar5;
  wallet_00 = (CWallet *)
              CWalletTx::GetHash((CWalletTx *)
                                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  COutPoint::COutPoint
            (in_stack_fffffffffffffd18,
             (Txid *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd0c);
  input_bytes = CalculateMaximumSignedInputSize
                          (txout_00,wallet_00,
                           (CCoinControl *)CONCAT44(depth_00,in_stack_fffffffffffffd68));
  CWalletTx::GetTxTime(in_stack_fffffffffffffd28);
  uVar6 = (uint)bVar3;
  std::optional<CFeeRate>::optional<CFeeRate_&,_true>
            ((optional<CFeeRate> *)in_stack_fffffffffffffd18,
             (CFeeRate *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  uVar6 = uVar6 & 1;
  uVar8 = 1;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK._7_1_ = bVar3;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK._0_7_ =
       in_stack_fffffffffffffdf0;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._8_8_ = in_RCX;
  COutput::COutput(in_RDI,(COutPoint *)txout_00,(CTxOut *)wallet_00,depth_00,input_bytes,
                   SUB41((uint)in_stack_00000008 >> 0x18,0),SUB41((uint)in_stack_00000008 >> 0x10,0)
                   ,SUB41((uint)in_stack_00000008 >> 8,0),in_stack_fffffffffffffde0,
                   SUB41(in_stack_00000008,0),feerate);
  CoinsResult::Add(local_168,in_stack_fffffffffffffd3c,
                   (COutput *)CONCAT44(in_stack_fffffffffffffd24,uVar6));
  COutput::~COutput((COutput *)CONCAT44(in_stack_fffffffffffffd0c,uVar8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffd0c,uVar8));
  CMutableTransaction::~CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffd0c,uVar8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addCoin(CoinsResult& coins,
                     CWallet& wallet,
                     const CTxDestination& dest,
                     const CAmount& nValue,
                     bool is_from_me,
                     CFeeRate fee_rate = CFeeRate(0),
                     int depth = 6)
{
    CMutableTransaction tx;
    tx.nLockTime = nextLockTime++;        // so all transactions get different hashes
    tx.vout.resize(1);
    tx.vout[0].nValue = nValue;
    tx.vout[0].scriptPubKey = GetScriptForDestination(dest);

    const auto txid{tx.GetHash().ToUint256()};
    LOCK(wallet.cs_wallet);
    auto ret = wallet.mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(txid), std::forward_as_tuple(MakeTransactionRef(std::move(tx)), TxStateInactive{}));
    assert(ret.second);
    CWalletTx& wtx = (*ret.first).second;
    const auto& txout = wtx.tx->vout.at(0);
    coins.Add(*Assert(OutputTypeFromDestination(dest)),
              {COutPoint(wtx.GetHash(), 0),
                   txout,
                   depth,
                   CalculateMaximumSignedInputSize(txout, &wallet, /*coin_control=*/nullptr),
                   /*spendable=*/ true,
                   /*solvable=*/ true,
                   /*safe=*/ true,
                   wtx.GetTxTime(),
                   is_from_me,
                   fee_rate});
}